

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O3

ConstantRange __thiscall slang::ConstantRange::subrange(ConstantRange *this,ConstantRange select)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ConstantRange CVar5;
  int iVar6;
  int iVar7;
  ConstantRange CVar8;
  
  iVar1 = this->left;
  iVar2 = this->right;
  iVar3 = iVar1;
  if (iVar2 < iVar1) {
    iVar3 = iVar2;
  }
  iVar4 = select.right;
  iVar6 = select.left;
  iVar7 = iVar6;
  if (iVar4 < iVar6) {
    iVar7 = iVar4;
  }
  CVar8.left = iVar7 + iVar3;
  if (iVar6 <= iVar4) {
    iVar6 = iVar4;
  }
  CVar8.right = iVar6 + iVar3;
  CVar5 = (ConstantRange)((long)CVar8 << 0x20 | (ulong)(uint)(iVar6 + iVar3));
  if (iVar2 <= iVar1) {
    CVar5 = CVar8;
  }
  return CVar5;
}

Assistant:

ConstantRange ConstantRange::subrange(ConstantRange select) const {
    int32_t l = lower();
    ConstantRange result;
    result.left = select.lower() + l;
    result.right = select.upper() + l;

    SLANG_ASSERT(result.right <= upper());
    if (isLittleEndian())
        return result;
    else
        return result.reverse();
}